

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

char * __thiscall QLatin1::convertFromUnicode(QLatin1 *this,char *out,QStringView in,State *state)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  storage_type_conflict *psVar5;
  ushort uVar6;
  ushort uVar7;
  
  uVar3 = *(uint *)in.m_size;
  lVar4 = 0;
  uVar6 = 0;
  if ((uVar3 & 2) == 0) {
    uVar6 = 0x3f;
  }
  if ((uVar3 & 1) != 0) {
    uVar6 = 0x3f;
  }
  if (0 < (long)in.m_data) {
    psVar5 = (storage_type_conflict *)0x0;
    lVar4 = 0;
    do {
      uVar2 = *(ushort *)(out + (long)psVar5 * 2);
      uVar7 = uVar2;
      if (uVar2 >= 0x100) {
        uVar7 = uVar6;
      }
      lVar4 = (lVar4 + 1) - (ulong)(uVar2 < 0x100);
      this[(long)psVar5] = SUB21(uVar7,0);
      psVar5 = (storage_type_conflict *)((long)psVar5 + 1);
    } while (in.m_data != psVar5);
    this = this + (long)psVar5;
  }
  if ((uVar3 & 1) == 0) {
    puVar1 = (uint *)in.m_size + 4;
    *(long *)puVar1 = *(long *)puVar1 + lVar4;
  }
  return (char *)this;
}

Assistant:

char *QLatin1::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state) noexcept
{
    Q_ASSERT(state);
    if (state->flags & QStringConverter::Flag::Stateless) // temporary
        state = nullptr;

    const char replacement = (state && state->flags & QStringConverter::Flag::ConvertInvalidToNull) ? 0 : '?';
    qsizetype invalid = 0;
    for (qsizetype i = 0; i < in.size(); ++i) {
        if (in[i] > QChar(0xff)) {
            *out = replacement;
            ++invalid;
        } else {
            *out = (char)in[i].cell();
        }
        ++out;
    }
    if (state)
        state->invalidChars += invalid;
    return out;
}